

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::anon_unknown_0::PythonGeneratorTest::PythonGeneratorTest
          (PythonGeneratorTest *this)

{
  pointer this_00;
  ParamType *pPVar1;
  Descriptor *pDVar2;
  FileDescriptor *pFVar3;
  string local_e8;
  string_view local_c8;
  string_view local_b8;
  allocator<char> local_a1;
  string local_a0;
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  local_80;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_49;
  string local_48;
  unique_ptr<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>_>
  local_18;
  __single_object generator;
  PythonGeneratorTest *this_local;
  
  generator._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::python::Generator_*,_std::default_delete<google::protobuf::compiler::python::Generator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::python::Generator_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>,_true,_true>
          )this;
  CommandLineInterfaceTester::CommandLineInterfaceTester(&this->super_CommandLineInterfaceTester);
  testing::WithParamInterface<bool>::WithParamInterface(&this->super_WithParamInterface<bool>);
  (this->super_CommandLineInterfaceTester).super_Test._vptr_Test =
       (_func_int **)&PTR__PythonGeneratorTest_02a12880;
  (this->super_WithParamInterface<bool>)._vptr_WithParamInterface =
       (_func_int **)&PTR__PythonGeneratorTest_02a128c0;
  std::make_unique<google::protobuf::compiler::python::Generator>();
  this_00 = std::
            unique_ptr<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>_>
            ::operator->(&local_18);
  pPVar1 = testing::WithParamInterface<bool>::GetParam();
  Generator::set_opensource_runtime(this_00,(bool)(*pPVar1 & 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"--python_out",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"--python_opt",&local_71);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
  ::
  unique_ptr<google::protobuf::compiler::python::Generator,std::default_delete<google::protobuf::compiler::python::Generator>,void>
            ((unique_ptr<google::protobuf::compiler::CodeGenerator,std::default_delete<google::protobuf::compiler::CodeGenerator>>
              *)&local_80,&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Python test generator",&local_a1);
  CommandLineInterfaceTester::RegisterGenerator
            (&this->super_CommandLineInterfaceTester,&local_48,&local_70,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::
  unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>
  ::~unique_ptr(&local_80);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pDVar2 = DescriptorProto::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  local_b8 = FileDescriptor::name(pFVar3);
  pDVar2 = DescriptorProto::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::DebugString_abi_cxx11_(&local_e8,pFVar3);
  local_c8 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e8);
  CommandLineInterfaceTester::CreateTempFile
            (&this->super_CommandLineInterfaceTester,local_b8,local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::
  unique_ptr<google::protobuf::compiler::python::Generator,_std::default_delete<google::protobuf::compiler::python::Generator>_>
  ::~unique_ptr(&local_18);
  return;
}

Assistant:

PythonGeneratorTest() {
    auto generator = std::make_unique<Generator>();
    generator->set_opensource_runtime(GetParam());
    RegisterGenerator("--python_out", "--python_opt", std::move(generator),
                      "Python test generator");

    // Generate built-in protos.
    CreateTempFile(
        google::protobuf::DescriptorProto::descriptor()->file()->name(),
        google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  }